

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::assert_vector_equal
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *lhs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *rhs)

{
  value_type vVar1;
  size_type a;
  size_type sVar2;
  const_reference pvVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t i;
  undefined8 in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char *file;
  unsigned_long in_stack_ffffffffffffffd8;
  size_type b;
  size_type local_18;
  
  a = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  _assert_int_equal(a,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  local_18 = 0;
  while( true ) {
    b = local_18;
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
    if (sVar2 <= b) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,local_18)
    ;
    file = (char *)*pvVar3;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_18)
    ;
    if (file != (char *)*pvVar3) {
      printf("Mismatch at %zu\n",local_18);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDI,local_18);
      vVar1 = *pvVar3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_18);
      _assert_int_equal(a,b,file,(int)(vVar1 >> 0x20));
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void assert_vector_equal(const std::vector<uint64_t>& lhs,
                         const std::vector<uint64_t>& rhs) {
    assert_int_equal(lhs.size(), rhs.size());
    for (size_t i = 0; i < lhs.size(); ++i) {
        if (lhs[i] != rhs[i]) {
            printf("Mismatch at %zu\n", i);
            assert_int_equal(lhs[i], rhs[i]);
        }
    }
}